

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool op_smmla(DisasContext_conflict1 *s,arg_rrrr *a,_Bool round,_Bool sub)

{
  int iVar1;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar2;
  ulong uVar3;
  _Bool _Var4;
  TCGTemp *a1;
  TCGTemp *pTVar5;
  TCGv_i32 al;
  uintptr_t o_3;
  TCGv_i32 var;
  TCGv_i32 var_00;
  uintptr_t o_1;
  TCGv_i32 var_01;
  uintptr_t o;
  TCGContext_conflict1 *tcg_ctx;
  
  s_00 = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    uVar3 = s->features & 8;
  }
  else {
    uVar3 = s->features >> 0x22 & 1;
  }
  if (uVar3 == 0) {
    _Var4 = false;
  }
  else {
    iVar1 = a->rn;
    a1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    var_00 = (TCGv_i32)((long)a1 - (long)s_00);
    load_reg_var(s,var_00,iVar1);
    iVar1 = a->rm;
    pTVar2 = s->uc->tcg_ctx;
    pTVar5 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar5 - (long)pTVar2);
    load_reg_var(s,var,iVar1);
    tcg_gen_muls2_i32_aarch64(s_00,var,var_00,var_00,var);
    iVar1 = a->ra;
    if (iVar1 != 0xf) {
      pTVar2 = s->uc->tcg_ctx;
      pTVar5 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
      var_01 = (TCGv_i32)((long)pTVar5 - (long)pTVar2);
      load_reg_var(s,var_01,iVar1);
      if (sub) {
        al = tcg_const_i32_aarch64(s_00,0);
        tcg_gen_sub2_i32_aarch64(s_00,var,var_00,al,var_01,var,var_00);
        tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(al + (long)s_00));
      }
      else {
        tcg_gen_op3_aarch64(s_00,INDEX_op_add_i32,(TCGArg)a1,(TCGArg)a1,
                            (TCGArg)((long)s_00 + (long)var_01));
      }
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var_01 + (long)s_00));
    }
    if (round) {
      tcg_gen_shri_i32_aarch64(s_00,var,var,0x1f);
      tcg_gen_op3_aarch64(s_00,INDEX_op_add_i32,(TCGArg)a1,(TCGArg)a1,
                          (TCGArg)((long)s_00 + (long)var));
    }
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var + (long)s_00));
    store_reg(s,a->rd,var_00);
    _Var4 = true;
  }
  return _Var4;
}

Assistant:

static bool op_smmla(DisasContext *s, arg_rrrr *a, bool round, bool sub)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_6) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    tcg_gen_muls2_i32(tcg_ctx, t2, t1, t1, t2);

    if (a->ra != 15) {
        TCGv_i32 t3 = load_reg(s, a->ra);
        if (sub) {
            /*
             * For SMMLS, we need a 64-bit subtract.  Borrow caused by
             * a non-zero multiplicand lowpart, and the correct result
             * lowpart for rounding.
             */
            TCGv_i32 zero = tcg_const_i32(tcg_ctx, 0);
            tcg_gen_sub2_i32(tcg_ctx, t2, t1, zero, t3, t2, t1);
            tcg_temp_free_i32(tcg_ctx, zero);
        } else {
            tcg_gen_add_i32(tcg_ctx, t1, t1, t3);
        }
        tcg_temp_free_i32(tcg_ctx, t3);
    }
    if (round) {
        /*
         * Adding 0x80000000 to the 64-bit quantity means that we have
         * carry in to the high word when the low word has the msb set.
         */
        tcg_gen_shri_i32(tcg_ctx, t2, t2, 31);
        tcg_gen_add_i32(tcg_ctx, t1, t1, t2);
    }
    tcg_temp_free_i32(tcg_ctx, t2);
    store_reg(s, a->rd, t1);
    return true;
}